

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_constants.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::ValidateConstantNull(ValidationState_t *_,Instruction *inst)

{
  Instruction *this;
  bool bVar1;
  uint32_t uVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *instruction;
  DiagnosticStream *pDVar3;
  string local_220;
  DiagnosticStream local_200;
  Instruction *local_28;
  Instruction *result_type;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  result_type = inst;
  inst_local = (Instruction *)_;
  uVar2 = Instruction::type_id(inst);
  local_28 = ValidationState_t::FindDef(_,uVar2);
  if (local_28 != (Instruction *)0x0) {
    instruction = Instruction::words(local_28);
    bVar1 = IsTypeNullable(instruction,(ValidationState_t *)inst_local);
    if (bVar1) {
      return SPV_SUCCESS;
    }
  }
  ValidationState_t::diag
            (&local_200,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,result_type);
  pDVar3 = DiagnosticStream::operator<<
                     (&local_200,(char (*) [33])"OpConstantNull Result Type <id> ");
  this = inst_local;
  uVar2 = Instruction::type_id(result_type);
  ValidationState_t::getIdName_abi_cxx11_(&local_220,(ValidationState_t *)this,uVar2);
  pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_220);
  pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [27])" cannot have a null value.");
  __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
  std::__cxx11::string::~string((string *)&local_220);
  DiagnosticStream::~DiagnosticStream(&local_200);
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateConstantNull(ValidationState_t& _,
                                  const Instruction* inst) {
  const auto result_type = _.FindDef(inst->type_id());
  if (!result_type || !IsTypeNullable(result_type->words(), _)) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "OpConstantNull Result Type <id> " << _.getIdName(inst->type_id())
           << " cannot have a null value.";
  }

  return SPV_SUCCESS;
}